

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildAsmCall
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,ArgSlot argCount,RegSlot ret,
          RegSlot function,int8 returnType,ProfileId profileId)

{
  SList<int,_Memory::ArenaAllocator,_RealCount> *this_00;
  SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  Func *pFVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  ProfileId PVar6;
  RegSlot RVar7;
  int iVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  ProfiledInstr *instr;
  JITTimeFunctionBody *pJVar11;
  Type *pTVar12;
  Type *ppIVar13;
  StackSym *pSVar14;
  Opnd *pOVar15;
  IntConstOpnd *this_01;
  undefined4 *puVar16;
  IRType IVar17;
  ulong value;
  undefined6 in_register_00000032;
  uint uVar18;
  int iVar19;
  ProfiledInstr *pPVar20;
  ProfiledInstr *pPVar21;
  ushort local_58;
  
  iVar19 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (1 < iVar19 - 0x1dU) {
    if (iVar19 == 0x12) {
      RVar7 = GetRegSlotFromTypedReg(this,function,INT64);
      pRVar9 = BuildSrcOpnd(this,RVar7,TyInt64);
      RVar7 = GetRegSlotFromTypedReg(this,ret,INT64);
      pRVar10 = BuildDstOpnd(this,RVar7,TyInt64);
      instr = (ProfiledInstr *)
              IR::Instr::New(AsmJsCallE,&pRVar10->super_Opnd,&pRVar9->super_Opnd,this->m_func);
      iVar19 = 0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x717,"((0))","(0)");
      if (!bVar5) goto LAB_004ff97a;
      *puVar16 = 0;
      iVar19 = 0;
      instr = (ProfiledInstr *)0x0;
    }
    goto LAB_004ff3f7;
  }
  RVar7 = GetRegSlotFromTypedReg(this,function,INT64);
  pRVar9 = BuildSrcOpnd(this,RVar7,TyInt64);
  switch(returnType) {
  case '\x01':
    RVar7 = GetRegSlotFromTypedReg(this,ret,INT64);
    IVar17 = TyInt64;
    goto LAB_004ff1a5;
  case '\x02':
    RVar7 = GetRegSlotFromTypedReg(this,ret,FLOAT64);
    IVar17 = TyFloat64;
    goto LAB_004ff174;
  case '\x03':
    RVar7 = GetRegSlotFromTypedReg(this,ret,FLOAT32);
    IVar17 = TyFloat32;
LAB_004ff174:
    pRVar10 = BuildDstOpnd(this,RVar7,IVar17);
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    goto LAB_004ff1b9;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x6f8,"((0))","(0)");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  case '\r':
    pRVar10 = (RegOpnd *)0x0;
    goto LAB_004ff204;
  case '\n':
    RVar7 = GetRegSlotFromTypedReg(this,ret,INT32);
    IVar17 = TyInt32;
LAB_004ff1a5:
    pRVar10 = BuildDstOpnd(this,RVar7,IVar17);
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
LAB_004ff1b9:
    IR::Opnd::SetValueType(&pRVar10->super_Opnd,(ValueType)valueType.field_0);
    goto LAB_004ff204;
  case '\x0e':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128I4;
    break;
  case '\x0f':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128U4;
    break;
  case '\x10':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128I8;
    break;
  case '\x11':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128I16;
    break;
  case '\x12':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128U8;
    break;
  case '\x13':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128U16;
    break;
  case '\x14':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128B4;
    break;
  case '\x15':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128B8;
    break;
  case '\x16':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128B16;
    break;
  case '\x17':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128F4;
    break;
  case '\x18':
    RVar7 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar17 = TySimd128D2;
  }
  pRVar10 = BuildDstOpnd(this,RVar7,IVar17);
LAB_004ff204:
  if (profileId == 0xffff) {
    instr = (ProfiledInstr *)
            IR::Instr::New(AsmJsCallI,&pRVar10->super_Opnd,&pRVar9->super_Opnd,this->m_func);
  }
  else {
    if (newOpcode != ProfiledI_Call) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x702,"(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)",
                         "newOpcode == Js::OpCodeAsmJs::ProfiledI_Call");
      if (!bVar5) goto LAB_004ff97a;
      *puVar16 = 0;
    }
    instr = IR::ProfiledInstr::New(AsmJsCallI,&pRVar10->super_Opnd,&pRVar9->super_Opnd,this->m_func)
    ;
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    PVar6 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar11);
    if (PVar6 <= profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x704,
                         "(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount())",
                         "profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount()");
      if (!bVar5) goto LAB_004ff97a;
      *puVar16 = 0;
    }
    if ((instr->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) goto LAB_004ff97a;
      *puVar16 = 0;
    }
    *(uint *)&instr->u = (uint)profileId;
  }
  if ((SList<int,_Memory::ArenaAllocator,_RealCount> *)
      (this->m_argOffsetStack->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argOffsetStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x708,"(!this->m_argOffsetStack->Empty())",
                       "!this->m_argOffsetStack->Empty()");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  this_00 = this->m_argOffsetStack;
  pTVar12 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>);
  iVar19 = *pTVar12;
  SListBase<int,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>,this_00->allocator);
  iVar19 = iVar19 + -8;
LAB_004ff3f7:
  AddInstr(this,&instr->super_Instr,offset);
  if ((SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)
      (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x71e,"(!this->m_argStack->Empty())","!this->m_argStack->Empty()");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  pSVar1 = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack;
  ppIVar13 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar1);
  pPVar21 = (ProfiledInstr *)*ppIVar13;
  SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (pSVar1,(ArenaAllocator *)pSVar1[1].super_SListNodeBase<Memory::ArenaAllocator>.next);
  if ((SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)
      (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    value = 0;
  }
  else {
    local_58 = newOpcode - I_Call;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar18 = 0;
    pPVar20 = pPVar21;
    do {
      pPVar21 = pPVar20;
      if ((pPVar20->super_Instr).m_opcode == StartCall) break;
      if (local_58 < 2) {
        pOVar15 = (pPVar20->super_Instr).m_dst;
        iVar8 = TySize[pOVar15->m_type];
        if (iVar8 < 9) {
          iVar8 = 8;
        }
        iVar19 = iVar19 - iVar8;
        pSVar14 = IR::Opnd::GetStackSym(pOVar15);
        pSVar14->m_offset = iVar19;
      }
      pOVar15 = (pPVar20->super_Instr).m_dst;
      if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_004ff97a;
        *puVar16 = 0;
      }
      pFVar2 = (instr->super_Instr).m_func;
      if (pOVar15->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) goto LAB_004ff97a;
        *puVar16 = 0;
      }
      bVar4 = pOVar15->field_0xb;
      if ((bVar4 & 2) != 0) {
        pOVar15 = IR::Opnd::Copy(pOVar15,pFVar2);
        bVar4 = pOVar15->field_0xb;
      }
      pOVar15->field_0xb = bVar4 | 2;
      (instr->super_Instr).m_src2 = pOVar15;
      uVar18 = uVar18 + 1;
      pSVar1 = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack;
      ppIVar13 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar1);
      pPVar21 = (ProfiledInstr *)*ppIVar13;
      SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (pSVar1,(ArenaAllocator *)pSVar1[1].super_SListNodeBase<Memory::ArenaAllocator>.next
                );
      instr = pPVar20;
      pPVar20 = pPVar21;
    } while ((SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)
             (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next != this->m_argStack);
    value = (ulong)(uVar18 & 0xffff);
  }
  if ((pPVar21->super_Instr).m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x733,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  this_01 = IR::IntConstOpnd::New(value,TyUint16,this->m_func,false);
  if ((pPVar21->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  pFVar2 = (pPVar21->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (IntConstOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar2);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  (pPVar21->super_Instr).m_src1 = &this_01->super_Opnd;
  if (iVar19 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x736,"(argOffset == 0)","argOffset == 0");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  pOVar15 = (pPVar21->super_Instr).m_dst;
  if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_004ff97a;
    *puVar16 = 0;
  }
  pFVar2 = (instr->super_Instr).m_func;
  if (pOVar15->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) {
LAB_004ff97a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar16 = 0;
  }
  bVar4 = pOVar15->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar15 = IR::Opnd::Copy(pOVar15,pFVar2);
    bVar4 = pOVar15->field_0xb;
  }
  pOVar15->field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src2 = pOVar15;
  if (this->m_func->m_argSlotsForFunctionsCalled < (uint)argCount) {
    this->m_func->m_argSlotsForFunctionsCalled = (uint)argCount;
  }
  bVar5 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar5) {
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar5 = JITTimeFunctionBody::IsWasmFunction(pJVar11);
    if (bVar5) {
      BuildHeapBufferReload(this,offset,false);
      return;
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmCall(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::ArgSlot argCount, Js::RegSlot ret, Js::RegSlot function, int8 returnType, Js::ProfileId profileId)
{
    Js::ArgSlot count = 0;

    IR::Instr * instr = nullptr;
    IR::RegOpnd * dstOpnd = nullptr;
    IR::Opnd * srcOpnd = nullptr;
    Js::RegSlot dstRegSlot;
    Js::RegSlot srcRegSlot;
    int32 argOffset = 0;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::I_Call:
    case Js::OpCodeAsmJs::ProfiledI_Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        switch ((Js::AsmJsRetType::Which)returnType)
        {
        case Js::AsmJsRetType::Which::Signed:
            dstRegSlot = GetRegSlotFromIntReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            dstRegSlot = GetRegSlotFromFloatReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            dstRegSlot = GetRegSlotFromDoubleReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Int64:
            dstRegSlot = GetRegSlotFromInt64Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Which::Float32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128F4);
            break;
        case Js::AsmJsRetType::Which::Int32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
            break;
        case Js::AsmJsRetType::Which::Bool32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B4);
            break;
        case Js::AsmJsRetType::Which::Bool16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B8);
            break;
        case Js::AsmJsRetType::Which::Bool8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B16);
            break;
        case Js::AsmJsRetType::Which::Float64x2:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128D2);
            break;
        case Js::AsmJsRetType::Which::Int16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I8);
            break;
        case Js::AsmJsRetType::Which::Int8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I16);
            break;
        case Js::AsmJsRetType::Which::Uint32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U4);
            break;
        case Js::AsmJsRetType::Which::Uint16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
            break;
        case Js::AsmJsRetType::Which::Uint8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U16);
            break;
#endif
        default:
            Assume(UNREACHED);
        }

        {
            if (profileId == Js::Constants::NoProfileId)
            {
                instr = IR::Instr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
            }
            else
            {
                Assert(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call);
                instr = IR::ProfiledInstr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
                AssertOrFailFast(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount());
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
        AssertOrFailFast(!this->m_argOffsetStack->Empty());
        argOffset = m_argOffsetStack->Pop();
        argOffset -= MachPtr;
        break;

    case Js::OpCodeAsmJs::Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        dstRegSlot = GetRegSlotFromPtrReg(ret);
        dstOpnd = BuildDstOpnd(dstRegSlot, TyMachReg);

        instr = IR::Instr::New(Js::OpCode::AsmJsCallE, dstOpnd, srcOpnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);

    IR::Instr * argInstr = nullptr;
    IR::Instr * prevInstr = instr;

    AssertOrFailFast(!this->m_argStack->Empty());
    for (argInstr = m_argStack->Pop(); !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall; argInstr = m_argStack->Pop())
    {
        if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
        {
#if _M_IX86
            argOffset -= argInstr->GetDst()->GetSize();
#elif _M_X64
            argOffset -= (argInstr->GetDst()->GetSize() <= MachPtr ? MachPtr : argInstr->GetDst()->GetSize());
#else
            Assert(UNREACHED);
#endif
            argInstr->GetDst()->GetStackSym()->m_offset = argOffset;

        }
        // associate the ArgOuts with this call via src2
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
        count++;
    }

    AssertOrFailFast(argInstr->m_opcode == Js::OpCode::StartCall);
    argInstr->SetSrc1(IR::IntConstOpnd::New(count, TyUint16, m_func));

    AssertOrFailFast(argOffset == 0);
    prevInstr->SetSrc2(argInstr->GetDst());

    // todo:: are we sure we don't need this for wasm ?
#ifdef ENABLE_SIMDJS
#if defined(_M_X64)
    // Without SIMD vars, all args are Var in size. So offset in Var = arg position in args list.
    // With SIMD, args have variable size, so we need to track argument position in the args list to be able to assign arg register for first four args on x64.
    if (m_func->IsSIMDEnabled())
    {
        for (uint i = 1; !m_tempList->Empty(); i++)
        {
            IR::Instr * instrArg = m_tempList->Pop();
            // record argument position and make room for implicit args
            instrArg->GetDst()->GetStackSym()->m_argPosition = i;
            if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
            {
                // implicit func obj arg
                instrArg->GetDst()->GetStackSym()->m_argPosition += 1;
            }
            else
            {
                // implicit func obj + callInfo args
                Assert(newOpcode == Js::OpCodeAsmJs::Call);
                instrArg->GetDst()->GetStackSym()->m_argPosition += 2;
            }
        }
    }
#endif
#endif
    if (m_func->m_argSlotsForFunctionsCalled < argCount)
    {
        m_func->m_argSlotsForFunctionsCalled = argCount;
    }
#ifdef ENABLE_WASM
    // heap buffer can change for wasm
    if (m_asmFuncInfo->UsesHeapBuffer() && m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        BuildHeapBufferReload(offset);
    }
#endif
}